

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<long_double,_10>::TPZManVector
          (TPZManVector<long_double,_10> *this,TPZVec<long_double> *copy)

{
  longdouble *plVar1;
  longdouble *plVar2;
  long lVar3;
  ulong uVar4;
  
  (this->super_TPZVec<long_double>).fStore = (longdouble *)0x0;
  (this->super_TPZVec<long_double>).fNElements = 0;
  (this->super_TPZVec<long_double>).fNAlloc = 0;
  (this->super_TPZVec<long_double>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181a218;
  uVar4 = copy->fNElements;
  if ((long)uVar4 < 0xb) {
    plVar2 = this->fExtAlloc;
    (this->super_TPZVec<long_double>).fStore = plVar2;
    (this->super_TPZVec<long_double>).fNElements = uVar4;
    (this->super_TPZVec<long_double>).fNAlloc = 0;
    if ((long)uVar4 < 1) {
      return;
    }
  }
  else {
    plVar2 = (longdouble *)operator_new__(-(ulong)(uVar4 >> 0x3c != 0) | uVar4 << 4);
    (this->super_TPZVec<long_double>).fStore = plVar2;
    (this->super_TPZVec<long_double>).fNElements = uVar4;
    (this->super_TPZVec<long_double>).fNAlloc = uVar4;
  }
  plVar1 = copy->fStore;
  lVar3 = 0;
  do {
    *(unkbyte10 *)((long)plVar2 + lVar3) = *(unkbyte10 *)((long)plVar1 + lVar3);
    lVar3 = lVar3 + 0x10;
    uVar4 = uVar4 - 1;
  } while (uVar4 != 0);
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(
        const TPZVec<T> & copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= (int64_t) (sizeof (fExtAlloc) / sizeof (T))) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy[i];
    }
}